

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

size_t __thiscall HFSubConsumer::available(HFSubConsumer *this,long timeout)

{
  size_t sVar1;
  int iVar2;
  timespec t;
  
  sVar1 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(&this->framequeue);
  if (timeout != 0 && sVar1 == 0) {
    if (timeout == 1) {
      t.tv_sec = 0;
      t.tv_nsec = 0x30958;
      iVar2 = 6;
      do {
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) goto LAB_00188c14;
        clock_nanosleep(1,1,(timespec *)&t,(timespec *)0x0);
        sVar1 = moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::size_approx(&this->framequeue);
      } while (sVar1 == 0);
    }
    else {
      zmq_poll(this->pollitem,1,0);
      if ((this->pollitem->revents & 1) != 0) {
        zsock_brecv(this->req,"8",&t);
      }
      zstr_send(this->req,"$WT");
      zmq_poll(this->pollitem,1,timeout);
      if ((this->pollitem->revents & 1) == 0) {
LAB_00188c14:
        sVar1 = 0;
      }
      else {
        zsock_brecv(this->req,"8",&t);
        sVar1 = t.tv_sec;
      }
    }
  }
  return sVar1;
}

Assistant:

size_t HFSubConsumer::available(long timeout){
    /* attempts at optimization:
     * 1. if timeout is 0ms, don't even send out polling request
     * 2. if timeout is 1ms, don't bother sending out polling req, but check queue 4 times
     *      - this way, worst case added latency is ~0.25ms
     * 3. else, clear the req-rep polls, send a wait request to other thread
     */ 
    size_t num = framequeue.size_approx();
    if(num || timeout == 0){
        return num;
    }
#ifdef __linux__
    else if(timeout == 1){
        const struct timespec t = {0, 199*1000};
        for(int i=0; i<5;i++){
            clock_nanosleep(CLOCK_MONOTONIC, TIMER_ABSTIME, &t, NULL);
            if((num=framequeue.size_approx())){
                return num;
            }
        }
    }
#endif
    else{
        uint64_t avail;
        //Polling could have timed out last time. First check if there is a message waiting to be grabbed.
        //If there is, it must be an old value since the framequeue size we got was 0. Toss it and try again.
        zmq_poll(pollitem, 1, 0);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
        }

        //Request again after clearing any messages.
        zstr_send(req, waittimeout);
        zmq_poll(pollitem, 1, timeout);
        if(pollitem->revents & ZMQ_POLLIN){
            zsock_brecv(req, "8", &avail);
            return avail;
        }
    }